

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::TransferTestInstance::initialImageTransition
          (TransferTestInstance *this,VkCommandBuffer cmdBuffer,VkImage image,
          VkImageSubresourceRange subRange,VkImageLayout layout)

{
  VkImageSubresourceRange VVar1;
  undefined4 local_78 [2];
  VkImageMemoryBarrier imageMemBarrier;
  DeviceInterface *vk;
  VkImageLayout layout_local;
  VkCommandBuffer cmdBuffer_local;
  TransferTestInstance *this_local;
  VkImage image_local;
  
  VVar1 = subRange;
  imageMemBarrier._64_8_ =
       Context::getDeviceInterface((this->super_TimestampTestInstance).super_TestInstance.m_context)
  ;
  local_78[0] = 0x2d;
  imageMemBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageMemBarrier._4_4_ = 0;
  imageMemBarrier.pNext._0_4_ = 0;
  imageMemBarrier.pNext._4_4_ = 0;
  imageMemBarrier.srcAccessMask = 0;
  imageMemBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageMemBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageMemBarrier.image.m_internal._0_4_ = subRange.aspectMask;
  imageMemBarrier.image.m_internal._4_4_ = subRange.baseMipLevel;
  subRange._8_8_ = VVar1._8_8_;
  imageMemBarrier.subresourceRange.aspectMask = subRange.levelCount;
  imageMemBarrier.subresourceRange.baseMipLevel = subRange.baseArrayLayer;
  subRange.layerCount = VVar1.layerCount;
  imageMemBarrier.subresourceRange.levelCount = subRange.layerCount;
  imageMemBarrier.dstAccessMask = layout;
  imageMemBarrier._32_8_ = image.m_internal;
  (*((DeviceInterface *)imageMemBarrier._64_8_)->_vptr_DeviceInterface[0x6d])
            (imageMemBarrier._64_8_,cmdBuffer,0x4000,1,0,0,0,0,0,1,local_78);
  return;
}

Assistant:

void TransferTestInstance::initialImageTransition (VkCommandBuffer cmdBuffer, VkImage image, VkImageSubresourceRange subRange, VkImageLayout layout)
{
	const DeviceInterface&		vk				= m_context.getDeviceInterface();
	const VkImageMemoryBarrier	imageMemBarrier	=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER, // VkStructureType          sType;
		DE_NULL,                                // const void*              pNext;
		0u,                                     // VkAccessFlags            srcAccessMask;
		0u,                                     // VkAccessFlags            dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,              // VkImageLayout            oldLayout;
		layout,                                 // VkImageLayout            newLayout;
		VK_QUEUE_FAMILY_IGNORED,                // uint32_t                 srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,                // uint32_t                 dstQueueFamilyIndex;
		image,                                  // VkImage                  image;
		subRange                                // VkImageSubresourceRange  subresourceRange;
	};

	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, 0, 0, DE_NULL, 0, DE_NULL, 1, &imageMemBarrier);
}